

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# queue.c
# Opt level: O0

void nn_queue_push(nn_queue *self,nn_queue_item *item)

{
  long *in_RSI;
  long *in_RDI;
  
  if (*in_RSI != -1) {
    nn_backtrace_print();
    fprintf(_stderr,"Assertion failed: %s (%s:%d)\n","item->next == NN_QUEUE_NOTINQUEUE",
            "/workspace/llm4binary/github/license_c_cmakelists/pietern[P]goestools/vendor/nanomsg/src/utils/queue.c"
            ,0x2f);
    fflush(_stderr);
    nn_err_abort();
  }
  *in_RSI = 0;
  if (*in_RDI == 0) {
    *in_RDI = (long)in_RSI;
  }
  if (in_RDI[1] != 0) {
    *(long **)in_RDI[1] = in_RSI;
  }
  in_RDI[1] = (long)in_RSI;
  return;
}

Assistant:

void nn_queue_push (struct nn_queue *self, struct nn_queue_item *item)
{
    nn_assert (item->next == NN_QUEUE_NOTINQUEUE);

    item->next = NULL;
    if (!self->head)
        self->head = item;
    if (self->tail)
        self->tail->next = item;
    self->tail = item;
}